

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool QApplicationPrivate::shouldSetFocus(QWidget *w,FocusPolicy policy)

{
  bool bVar1;
  FocusPolicy FVar2;
  long lVar3;
  long lVar4;
  QWidget *this;
  
  lVar3 = *(long *)(*(long *)&w->field_0x8 + 0x78);
  this = w;
  if ((lVar3 != 0) && (lVar4 = *(long *)(lVar3 + 0x30), lVar4 != 0)) {
    while ((*(int *)(lVar4 + 4) != 0 && (*(long *)(lVar3 + 0x38) != 0))) {
      this = *(QWidget **)(lVar3 + 0x38);
      lVar3 = *(long *)(*(long *)&this->field_0x8 + 0x78);
      if ((lVar3 == 0) || (lVar4 = *(long *)(lVar3 + 0x30), lVar4 == 0)) break;
    }
  }
  FVar2 = QWidget::focusPolicy(w);
  if (((policy & ~FVar2) == NoFocus) &&
     ((this == w || (FVar2 = QWidget::focusPolicy(this), (policy & ~FVar2) == NoFocus)))) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool QApplicationPrivate::shouldSetFocus(QWidget *w, Qt::FocusPolicy policy)
{
    QWidget *f = w;
    while (f->d_func()->extra && f->d_func()->extra->focus_proxy)
        f = f->d_func()->extra->focus_proxy;

    if ((w->focusPolicy() & policy) != policy)
        return false;
    if (w != f && (f->focusPolicy() & policy) != policy)
        return false;
    return true;
}